

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O2

uint16_t IT8951ReadReg(uint16_t usRegAddr)

{
  uint16_t uVar1;
  
  LCDWriteCmdCode(0x10);
  LCDWriteData(usRegAddr);
  uVar1 = LCDReadData();
  return uVar1;
}

Assistant:

uint16_t IT8951ReadReg(uint16_t usRegAddr)
{
	uint16_t usData;
	
	//Send Cmd and Register Address
	LCDWriteCmdCode(IT8951_TCON_REG_RD);
	LCDWriteData(usRegAddr);
	//Read data from Host Data bus
	usData = LCDReadData();
	return usData;
}